

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_stxvh8x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 EA;
  TCGv_i64 outh;
  TCGv_i64 outl;
  uintptr_t o_1;
  uintptr_t o;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    dst = tcg_temp_new_i64(tcg_ctx);
    dst_00 = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx,dst,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5);
    get_cpu_vsrl(tcg_ctx,dst_00,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5);
    gen_set_access_type(ctx,0x20);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    if (ctx->le_mode == true) {
      outh = tcg_temp_new_i64(tcg_ctx);
      outl = tcg_temp_new_i64(tcg_ctx);
      gen_bswap16x8(tcg_ctx,outh,outl,dst,dst_00);
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx,outh,EA,(long)ctx->mem_idx,MO_BEQ);
      tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx,outl,EA,(long)ctx->mem_idx,MO_BEQ);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(outh + (long)tcg_ctx));
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(outl + (long)tcg_ctx));
    }
    else {
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx,dst,EA,(long)ctx->mem_idx,MO_BEQ);
      tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx,dst_00,EA,(long)ctx->mem_idx,MO_BEQ);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_00 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_stxvh8x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 xsh;
    TCGv_i64 xsl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xsh = tcg_temp_new_i64(tcg_ctx);
    xsl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xsh, xS(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xsl, xS(ctx->opcode));
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    if (ctx->le_mode) {
        TCGv_i64 outh = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 outl = tcg_temp_new_i64(tcg_ctx);

        gen_bswap16x8(tcg_ctx, outh, outl, xsh, xsl);
        tcg_gen_qemu_st_i64(tcg_ctx, outh, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_st_i64(tcg_ctx, outl, EA, ctx->mem_idx, MO_BEQ);
        tcg_temp_free_i64(tcg_ctx, outh);
        tcg_temp_free_i64(tcg_ctx, outl);
    } else {
        tcg_gen_qemu_st_i64(tcg_ctx, xsh, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_st_i64(tcg_ctx, xsl, EA, ctx->mem_idx, MO_BEQ);
    }
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, xsh);
    tcg_temp_free_i64(tcg_ctx, xsl);
}